

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonParser.cpp
# Opt level: O0

string * __thiscall
Json::JsonParser::parseNull_abi_cxx11_(string *__return_storage_ptr__,JsonParser *this,char prev)

{
  bool bVar1;
  char cVar2;
  JsonException *this_00;
  char *__s;
  allocator<char> local_6e;
  char local_6d;
  char c;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  char local_19;
  JsonParser *pJStack_18;
  char prev_local;
  JsonParser *this_local;
  
  local_19 = prev;
  pJStack_18 = this;
  this_local = (JsonParser *)__return_storage_ptr__;
  buffer_reset(this);
  while( true ) {
    cVar2 = local_19;
    JsonReader::substr_abi_cxx11_(&local_60,&this->__reader,3,false);
    std::operator+(&local_40,cVar2,&local_60);
    bVar1 = std::operator==(&local_40,"null");
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_60);
    if (bVar1) {
      buffer_append(this,"null");
      JsonReader::moveTo(&this->__reader,3);
    }
    local_6d = JsonReader::peek(&this->__reader);
    if (((local_6d == ',') || (local_6d == '}')) || (local_6d == ']')) break;
    cVar2 = JsonReader::get(&this->__reader);
    bVar1 = is_space_char(cVar2);
    if (!bVar1) {
      this_00 = (JsonException *)__cxa_allocate_exception(0x50);
      JsonException::JsonException(this_00,&this->__reader);
      __cxa_throw(this_00,&JsonException::typeinfo,JsonException::~JsonException);
    }
  }
  __s = buffer_str(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,&local_6e)
  ;
  std::allocator<char>::~allocator(&local_6e);
  return __return_storage_ptr__;
}

Assistant:

std::string Json::JsonParser::parseNull(char prev) {
    buffer_reset();
    for (;;) {
        if (prev + __reader.substr(3) == "null") {
            buffer_append("null");
            __reader.moveTo(3);
        }
        char c = __reader.peek();
        if (c == JSON_SEPARATE || c == JSON_OBJECT_END || c == JSON_ARRAY_END) {
            break;
        } else if (is_space_char(__reader.get()))continue;
        else throw JsonException(__reader);
    }
    return buffer_str();
}